

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

int Tas_ManSolve(Tas_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pObj2)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  int *piVar6;
  int *piVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  s_Counter2 = 0;
  p->vModel->nSize = 0;
  pGVar3 = p->pAig->pObjs;
  iVar9 = 1;
  if (((pGVar3 != pObj2 && pGVar3 != pObj) && ((Gia_Obj_t *)((ulong)pObj2 ^ 1) != pObj)) &&
     (((Gia_Obj_t *)((ulong)pGVar3 ^ 1) != pObj ||
      ((iVar9 = 0, pObj2 != (Gia_Obj_t *)0x0 && ((Gia_Obj_t *)((ulong)pGVar3 ^ 1) != pObj2)))))) {
    if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
      __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x55f,"int Tas_ManSolve(Tas_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
      __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x560,"int Tas_ManSolve(Tas_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
      __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x561,"int Tas_ManSolve(Tas_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    (p->Pars).nJustThis = 0;
    (p->Pars).nBTThis = 0;
    (p->Pars).nBTThisNc = 0;
    Tas_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    if ((pObj2 != (Gia_Obj_t *)0x0) &&
       ((*(byte *)(((ulong)pObj2 & 0xfffffffffffffffe) + 3) & 0x40) == 0)) {
      Tas_ManAssign(p,pObj2,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    }
    iVar9 = Tas_ManSolve_rec(p,0);
    iVar11 = 1;
    if (((iVar9 == 0) && ((p->Pars).nJustThis <= (p->Pars).nJustLimit)) &&
       ((p->Pars).nBTThis <= (p->Pars).nBTLimit)) {
      pVVar4 = p->vModel;
      iVar11 = 0;
      pVVar4->nSize = 0;
      (p->pProp).iHead = 0;
      if (0 < (p->pProp).iTail) {
        iVar11 = 0;
        lVar10 = 0;
        do {
          pGVar3 = (p->pProp).pData[lVar10];
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar5 = *(ulong *)pGVar3;
          if ((~(uint)uVar5 & 0x9fffffff) == 0) {
            if (((uint)uVar5 >> 0x1e & 1) == 0) {
              __assert_fail("pVar->fMark0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                            ,0x78,"int Tas_VarValue(Gia_Obj_t *)");
            }
            Vec_IntPush(pVVar4,((uint)(uVar5 >> 0x1f) & 0x3ffffffe | (uint)(uVar5 >> 0x3e) & 1) ^ 1)
            ;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (p->pProp).iTail);
      }
    }
    iVar9 = (p->pProp).iTail;
    if (iVar9 < 0) {
      __assert_fail("iBound <= p->pProp.iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x277,"void Tas_ManCancelUntil(Tas_Man_t *, int)");
    }
    (p->pProp).iHead = 0;
    if (iVar9 != 0) {
      lVar10 = 0;
      do {
        pGVar3 = (p->pProp).pData[lVar10];
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (((uint)*(ulong *)pGVar3 >> 0x1e & 1) == 0) {
          __assert_fail("pVar->fMark0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x77,"void Tas_VarUnassign(Gia_Obj_t *)");
        }
        *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffbfffffff;
        pGVar3->Value = 0xffffffff;
        lVar10 = lVar10 + 1;
      } while (lVar10 < (p->pProp).iTail);
    }
    (p->pProp).iTail = 0;
    if (p->vLevReas->nSize < 0) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    p->vLevReas->nSize = 0;
    (p->pJust).iHead = 0;
    (p->pJust).iTail = 0;
    (p->pClauses).iHead = 1;
    (p->pClauses).iTail = 1;
    if (0 < p->nClauses) {
      (p->pStore).iCur = 0x10;
      pVVar4 = p->vWatchLits;
      if (0 < pVVar4->nSize) {
        piVar6 = pVVar4->pArray;
        piVar7 = p->pWatches;
        lVar10 = 0;
        do {
          piVar7[piVar6[lVar10]] = 0;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar4->nSize);
      }
      pVVar4->nSize = 0;
      p->nClauses = 0;
    }
    pVVar4 = p->vActiveVars;
    iVar9 = pVVar4->nSize;
    if (0 < (long)iVar9) {
      piVar6 = pVVar4->pArray;
      pfVar8 = p->pActivity;
      lVar10 = 0;
      do {
        pfVar8[piVar6[lVar10]] = 0.0;
        lVar10 = lVar10 + 1;
      } while (iVar9 != lVar10);
    }
    pVVar4->nSize = 0;
    iVar1 = (p->Pars).nBTThis;
    iVar2 = (p->Pars).nJustThis;
    piVar6 = &(p->Pars).nBTTotal;
    *piVar6 = *piVar6 + iVar1;
    iVar9 = (p->Pars).nJustTotal;
    if (iVar9 <= iVar2) {
      iVar9 = iVar2;
    }
    (p->Pars).nJustTotal = iVar9;
    iVar9 = -1;
    if ((iVar2 <= (p->Pars).nJustLimit) && (iVar9 = iVar11, (p->Pars).nBTLimit < iVar1)) {
      iVar9 = -1;
    }
  }
  return iVar9;
}

Assistant:

int Tas_ManSolve( Tas_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pObj2 )
{
    int i, Entry, RetValue = 0;
    s_Counter2 = 0;
    Vec_IntClear( p->vModel );
    if ( pObj == Gia_ManConst0(p->pAig) || pObj2 == Gia_ManConst0(p->pAig) || pObj == Gia_Not(pObj2) )
        return 1;
    if ( pObj == Gia_ManConst1(p->pAig) && (pObj2 == NULL || pObj2 == Gia_ManConst1(p->pAig)) )
        return 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Tas_ManAssign( p, pObj, 0, NULL, NULL );
    if ( pObj2 && !Tas_VarIsAssigned(Gia_Regular(pObj2)) )
        Tas_ManAssign( p, pObj2, 0, NULL, NULL );
    if ( !Tas_ManSolve_rec(p, 0) && !Tas_ManCheckLimits(p) )
        Tas_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Tas_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    // clauses
    if ( p->nClauses > 0 )
    {
        p->pStore.iCur = 16;
        Vec_IntForEachEntry( p->vWatchLits, Entry, i )
            p->pWatches[Entry] = 0;
        Vec_IntClear( p->vWatchLits );
        p->nClauses = 0;
    }
    // activity
    Vec_IntForEachEntry( p->vActiveVars, Entry, i )
        p->pActivity[Entry] = 0.0;
    Vec_IntClear( p->vActiveVars );
    // statistics
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Tas_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}